

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userop.cc
# Opt level: O0

VolatileOp * __thiscall VolatileOp::appendSize(VolatileOp *this,string *base,int4 size)

{
  ostream *poVar1;
  void *this_00;
  ostringstream local_198 [8];
  ostringstream s;
  int4 size_local;
  string *base_local;
  
  if (size == 1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)base);
  }
  else if (size == 2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)base);
  }
  else if (size == 4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)base);
  }
  else if (size == 8) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (char *)base);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar1 = std::operator<<((ostream *)local_198,(string *)base);
    poVar1 = std::operator<<(poVar1,'_');
    this_00 = (void *)std::ostream::operator<<(poVar1,std::dec);
    std::ostream::operator<<(this_00,size);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return this;
}

Assistant:

string VolatileOp::appendSize(const string &base,int4 size)

{
  if (size==1)
    return base + "_1";
  if (size==2)
    return base + "_2";
  if (size==4)
    return base + "_4";
  if (size==8)
    return base + "_8";
  ostringstream s;
  s << base << '_' << dec << size;
  return s.str();
}